

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O0

void __thiscall
rtosc::MidiMapperRT::handleCC(MidiMapperRT *this,int par,int val,char chan,bool isNrpn)

{
  bool bVar1;
  bool bVar2;
  char in_CL;
  undefined4 in_EDX;
  int in_ESI;
  PendingQueue *in_RDI;
  byte in_R8B;
  char msg [1024];
  int ID;
  undefined4 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7c;
  undefined1 in_stack_fffffffffffffb7e;
  byte bVar3;
  undefined1 uVar4;
  PendingQueue *in_stack_fffffffffffffb80;
  char local_458 [80];
  write_cb *in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc04;
  MidiMapperStorage *in_stack_fffffffffffffc08;
  function<void_(const_char_*)> local_38;
  uint local_18;
  byte local_12;
  char local_11;
  
  local_12 = in_R8B & 1;
  local_11 = in_CL;
  if (in_CL < '\x01') {
    local_11 = '\x01';
  }
  local_18 = (uint)local_12 * 0x40000 + ((int)local_11 - 1U & 0xf) * 0x4000 + in_ESI;
  bVar1 = false;
  if (*(long *)(in_RDI[1].vals + 1) != 0) {
    in_stack_fffffffffffffb80 = *(PendingQueue **)(in_RDI[1].vals + 1);
    std::function<void_(const_char_*)>::function
              (&local_38,(function<void_(const_char_*)> *)CONCAT44(in_EDX,local_18));
    bVar1 = true;
    bVar2 = MidiMapperStorage::handleCC
                      (in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,in_stack_fffffffffffffc00
                       ,in_stack_fffffffffffffbf8);
    bVar3 = false;
    if (bVar2) goto LAB_0012b17e;
  }
  in_stack_fffffffffffffb7e = PendingQueue::has(in_RDI,local_18);
  bVar3 = false;
  if (!(bool)in_stack_fffffffffffffb7e) {
    bVar3 = in_RDI[1].vals[3] != 0;
  }
LAB_0012b17e:
  uVar4 = bVar3;
  if (bVar1) {
    std::function<void_(const_char_*)>::~function((function<void_(const_char_*)> *)0x12b19f);
  }
  if ((bVar3 & 1) != 0) {
    in_RDI[1].vals[3] = in_RDI[1].vals[3] + -1;
    PendingQueue::insert
              (in_stack_fffffffffffffb80,
               CONCAT13(uVar4,CONCAT12(in_stack_fffffffffffffb7e,
                                       CONCAT11(bVar3,in_stack_fffffffffffffb7c))));
    rtosc_message(local_458,0x400,"/midi-use-CC","i",(ulong)local_18);
    std::function<void_(const_char_*)>::operator()
              ((function<void_(const_char_*)> *)in_stack_fffffffffffffb80,
               (char *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffb7e,
                                               CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffffb7c,
                                                                       in_stack_fffffffffffffb78))))
              );
  }
  return;
}

Assistant:

void MidiMapperRT::handleCC(int par, int val, char chan, bool isNrpn) {
    
    if(chan<1) chan=1;
    int ID = (isNrpn<<18) + (((chan-1)&0x0f)<<14) + par;
    //printf("handling CC(%d,%d){%d,%d,%d}\n", ID, val, (int)storage, pending.has(ID), watchSize);
    if((!storage || !storage->handleCC(ID, val, backend)) && !pending.has(ID) && watchSize) {
        watchSize--;
        pending.insert(ID);
        char msg[1024];
        rtosc_message(msg, 1024, "/midi-use-CC", "i", ID);
        frontend(msg);
    }
}